

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O1

int SUNLinSolSetup_SPGMR(SUNLinearSolver S,SUNMatrix A)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  
  if (S == (SUNLinearSolver)0x0) {
    iVar3 = -0x321;
  }
  else {
    pcVar1 = *(code **)((long)S->content + 0x38);
    iVar3 = 0;
    if (pcVar1 != (code *)0x0) {
      iVar2 = (*pcVar1)(*(undefined8 *)((long)S->content + 0x48));
      iVar3 = 0;
      if (iVar2 != 0) {
        iVar3 = 0x324;
        if (iVar2 < 0) {
          iVar3 = -0x326;
        }
        *(int *)((long)S->content + 0x20) = iVar3;
      }
    }
  }
  return iVar3;
}

Assistant:

int SUNLinSolSetup_SPGMR(SUNLinearSolver S, SUNMatrix A)
{
  int ier;
  SUNPSetupFn Psetup;
  void* PData;

  /* Set shortcuts to SPGMR memory structures */
  if (S == NULL) return(SUNLS_MEM_NULL);
  Psetup = SPGMR_CONTENT(S)->Psetup;
  PData = SPGMR_CONTENT(S)->PData;

  /* no solver-specific setup is required, but if user-supplied
     Psetup routine exists, call that here */
  if (Psetup != NULL) {
    ier = Psetup(PData);
    if (ier != 0) {
      LASTFLAG(S) = (ier < 0) ?
        SUNLS_PSET_FAIL_UNREC : SUNLS_PSET_FAIL_REC;
      return(LASTFLAG(S));
    }
  }

  /* return with success */
  return(SUNLS_SUCCESS);
}